

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall xLearn::FFMParser::~FFMParser(FFMParser *this)

{
  void *in_RDI;
  
  ~FFMParser((FFMParser *)0x207d28);
  operator_delete(in_RDI);
  return;
}

Assistant:

~FFMParser() {  }